

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkMutableDescriptorTypeCreateInfoEXT *mutable_info)

{
  VkMutableDescriptorTypeListEXT *pVVar1;
  uint local_34;
  uint32_t j;
  VkMutableDescriptorTypeListEXT *l;
  uint32_t i;
  VkMutableDescriptorTypeCreateInfoEXT *mutable_info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,mutable_info->mutableDescriptorTypeListCount);
  for (l._4_4_ = 0; l._4_4_ < mutable_info->mutableDescriptorTypeListCount; l._4_4_ = l._4_4_ + 1) {
    pVVar1 = mutable_info->pMutableDescriptorTypeLists + l._4_4_;
    Hasher::u32(h,pVVar1->descriptorTypeCount);
    for (local_34 = 0; local_34 < pVVar1->descriptorTypeCount; local_34 = local_34 + 1) {
      Hasher::s32(h,pVVar1->pDescriptorTypes[local_34]);
    }
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkMutableDescriptorTypeCreateInfoEXT &mutable_info)
{
	h.u32(mutable_info.mutableDescriptorTypeListCount);
	for (uint32_t i = 0; i < mutable_info.mutableDescriptorTypeListCount; i++)
	{
		auto &l = mutable_info.pMutableDescriptorTypeLists[i];
		h.u32(l.descriptorTypeCount);
		for (uint32_t j = 0; j < l.descriptorTypeCount; j++)
			h.s32(l.pDescriptorTypes[j]);
	}
}